

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

void __thiscall Fossilize::DatabaseInterface::~DatabaseInterface(DatabaseInterface *this)

{
  uint8_t *__addr;
  Impl *pIVar1;
  pointer ppEVar2;
  pointer puVar3;
  DatabaseInterface *pDVar4;
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> _Var5;
  pointer *__ptr;
  long lVar6;
  
  this->_vptr_DatabaseInterface = (_func_int **)&PTR__DatabaseInterface_0016ca20;
  __addr = this->impl->mapped_metadata;
  if (__addr != (uint8_t *)0x0) {
    munmap(__addr,this->impl->mapped_metadata_size);
  }
  pIVar1 = this->impl;
  if (pIVar1 != (Impl *)0x0) {
    ppEVar2 = (pIVar1->imported_metadata).
              super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar2 != (pointer)0x0) {
      operator_delete(ppEVar2,(long)(pIVar1->imported_metadata).
                                    super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppEVar2);
    }
    lVar6 = 0x220;
    do {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)pIVar1->implicit_whitelisted + lVar6 + -0x28));
      lVar6 = lVar6 + -0x38;
    } while (lVar6 != -0x10);
    puVar3 = (pIVar1->sub_databases_in_whitelist).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3,(long)(pIVar1->sub_databases_in_whitelist).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3)
      ;
    }
    pDVar4 = (pIVar1->blacklist)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar4 != (DatabaseInterface *)0x0) {
      (*pDVar4->_vptr_DatabaseInterface[1])();
    }
    (pIVar1->blacklist)._M_t.
    super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
    .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
         (DatabaseInterface *)0x0;
    _Var5._M_head_impl =
         (pIVar1->whitelist)._M_t.
         super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
         ._M_t.
         super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
         .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (_Var5._M_head_impl != (DatabaseInterface *)0x0) {
      (**(code **)((long)(_Var5._M_head_impl)->_vptr_DatabaseInterface + 8))();
    }
    (pIVar1->whitelist)._M_t.
    super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
    .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
         (DatabaseInterface *)0x0;
    operator_delete(pIVar1,0x290);
    return;
  }
  return;
}

Assistant:

DatabaseInterface::~DatabaseInterface()
{
#ifdef _WIN32
	if (impl->mapped_metadata)
		UnmapViewOfFile(impl->mapped_metadata);
#else
	if (impl->mapped_metadata)
		munmap(const_cast<uint8_t *>(impl->mapped_metadata), impl->mapped_metadata_size);
#endif
	delete impl;
}